

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_rest_resp(Curl_easy *data,connectdata *conn,int ftpcode,ftpstate instate)

{
  CURLcode CVar1;
  size_t len;
  char buffer [24];
  char local_38 [32];
  
  if (instate == FTP_RETR_REST) {
    if (ftpcode == 0x15e) {
      CVar1 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"RETR %s",(conn->proto).ftpc.file);
      if (CVar1 == CURLE_OK) {
        (data->conn->proto).ftpc.state = FTP_RETR;
        CVar1 = CURLE_OK;
      }
    }
    else {
      Curl_failf(data,"Couldn\'t use REST");
      CVar1 = CURLE_FTP_COULDNT_USE_REST;
    }
  }
  else {
    if (ftpcode == 0x15e) {
      builtin_strncpy(local_38,"Accept-ranges: bytes\r\n",0x17);
      local_38[0x17] = '\0';
      len = strlen(local_38);
      CVar1 = Curl_client_write(data,3,local_38,len);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
    }
    CVar1 = ftp_state_prepare_transfer(data);
  }
  return CVar1;
}

Assistant:

static CURLcode ftp_state_rest_resp(struct Curl_easy *data,
                                    struct connectdata *conn,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  switch(instate) {
  case FTP_REST:
  default:
#ifdef CURL_FTP_HTTPSTYLE_HEAD
    if(ftpcode == 350) {
      char buffer[24]= { "Accept-ranges: bytes\r\n" };
      result = Curl_client_write(data, CLIENTWRITE_BOTH, buffer,
                                 strlen(buffer));
      if(result)
        return result;
    }
#endif
    result = ftp_state_prepare_transfer(data);
    break;

  case FTP_RETR_REST:
    if(ftpcode != 350) {
      failf(data, "Couldn't use REST");
      result = CURLE_FTP_COULDNT_USE_REST;
    }
    else {
      result = Curl_pp_sendf(data, &ftpc->pp, "RETR %s", ftpc->file);
      if(!result)
        state(data, FTP_RETR);
    }
    break;
  }

  return result;
}